

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  char **ppcVar6;
  char *pcVar7;
  int unaff_R13D;
  
  do {
    lVar5 = (long)end - (long)ptr;
    if (lVar5 < 1) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    ppcVar6 = (char **)(ulong)bVar1;
    if (ppcVar6 < (char **)0xe) {
      pcVar7 = (char *)((long)&switchD_00559f18::switchdataD_0066e1f4 +
                       (long)(int)(&switchD_00559f18::switchdataD_0066e1f4)[(long)ppcVar6]);
      switch(ppcVar6) {
      case (char **)0x0:
      case (char **)0x1:
      case (char **)0x8:
        break;
      default:
        goto switchD_00559f18_caseD_2;
      case (char **)0x5:
        if (lVar5 != 1) {
          iVar4 = (*enc[3].literalScanners[1])(enc,ptr,pcVar7,ppcVar6);
          if (iVar4 != 0) break;
          ptr = (char *)((byte *)ptr + 2);
          goto LAB_00559fc8;
        }
LAB_00559fb3:
        unaff_R13D = -2;
        goto LAB_00559fb9;
      case (char **)0x6:
        if (lVar5 < 3) goto LAB_00559fb3;
        iVar4 = (*enc[3].sameName)(enc,ptr,pcVar7);
        if (iVar4 == 0) {
          ptr = (char *)((byte *)ptr + 3);
          goto LAB_00559fc8;
        }
        break;
      case (char **)0x7:
        if (lVar5 < 4) goto LAB_00559fb3;
        iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar7,(char *)ppcVar6);
        if (iVar4 == 0) {
          ptr = (char *)((byte *)ptr + 4);
          goto LAB_00559fc8;
        }
        break;
      case (char **)0xc:
      case (char **)0xd:
        ptr = (char *)((byte *)ptr + 1);
        bVar2 = true;
        if ((uint)bVar1 == open) {
          if (end == ptr || (long)end - (long)ptr < 0) {
            unaff_R13D = -0x1b;
          }
          else {
            *nextTokPtr = ptr;
            unaff_R13D = 0;
            uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
            if ((uVar3 < 0x1f) && ((0x40300e00U >> (uVar3 & 0x1f) & 1) != 0)) {
              unaff_R13D = 0x1b;
            }
          }
          goto LAB_00559fb9;
        }
        goto LAB_00559fbb;
      }
      *nextTokPtr = ptr;
      unaff_R13D = 0;
LAB_00559fb9:
      bVar2 = false;
    }
    else {
switchD_00559f18_caseD_2:
      ptr = (char *)((byte *)ptr + 1);
LAB_00559fc8:
      bVar2 = true;
    }
LAB_00559fbb:
    if (!bVar2) {
      return unaff_R13D;
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanLit)(int open, const ENCODING *enc,
                const char *ptr, const char *end,
                const char **nextTokPtr)
{
  while (HAS_CHAR(enc, ptr, end)) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (! HAS_CHAR(enc, ptr, end))
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}